

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

void Amap_ManCreateChoice(Amap_Man_t *p,Amap_Obj_t *pObj)

{
  uint uVar1;
  Amap_Obj_t *local_20;
  Amap_Obj_t *pTemp;
  Amap_Obj_t *pObj_local;
  Amap_Man_t *p_local;
  
  *(ulong *)pObj = *(ulong *)pObj & 0xbfffffffffffffff | 0x4000000000000000;
  for (local_20 = pObj; local_20 != (Amap_Obj_t *)0x0; local_20 = Amap_ObjChoice(p,local_20)) {
    uVar1 = Abc_MaxInt(*(uint *)&pObj->field_0x8 & 0xfff,*(uint *)&local_20->field_0x8 & 0xfff);
    *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0xfffff000 | uVar1 & 0xfff;
  }
  if (p->nLevelMax < (int)(*(uint *)&pObj->field_0x8 & 0xfff)) {
    p->nLevelMax = *(uint *)&pObj->field_0x8 & 0xfff;
  }
  if (p->nLevelMax < 0xffe) {
    return;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapGraph.c"
                ,0xed,"void Amap_ManCreateChoice(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManCreateChoice( Amap_Man_t * p, Amap_Obj_t * pObj )
{
    Amap_Obj_t * pTemp;
    // mark the node as a representative if its class
//    assert( pObj->fRepr == 0 );
    pObj->fRepr = 1;
    // update the level of this node (needed for correct required time computation)
    for ( pTemp = pObj; pTemp; pTemp = Amap_ObjChoice(p, pTemp) )
    {
        pObj->Level = Abc_MaxInt( pObj->Level, pTemp->Level );
//        pTemp->nVisits++; pTemp->nVisitsCopy++;
    }
    // mark the largest level
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
}